

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ConsumeInteger64
          (Parser *this,uint64 max_value,uint64 *output,char *error)

{
  bool bVar1;
  char *in_RCX;
  undefined8 *in_RDX;
  Parser *in_RDI;
  Tokenizer *in_stack_00000028;
  undefined8 in_stack_ffffffffffffff58;
  Parser *in_stack_ffffffffffffff60;
  allocator *paVar2;
  string *in_stack_ffffffffffffff68;
  string *error_00;
  uint64 *in_stack_ffffffffffffff78;
  uint64 in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  undefined1 local_49 [33];
  char *local_28;
  undefined8 *local_20;
  bool local_1;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  bVar1 = LookingAtType(in_stack_ffffffffffffff60,
                        (TokenType)((ulong)in_stack_ffffffffffffff58 >> 0x20));
  if (bVar1) {
    io::Tokenizer::current(in_RDI->input_);
    bVar1 = io::Tokenizer::ParseInteger
                      (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78
                      );
    if (!bVar1) {
      error_00 = (string *)local_49;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_49 + 1),"Integer out of range.",(allocator *)error_00);
      AddError(in_RDI,error_00);
      std::__cxx11::string::~string((string *)(local_49 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_49);
      *local_20 = 0;
    }
    io::Tokenizer::Next(in_stack_00000028);
    local_1 = true;
  }
  else {
    paVar2 = (allocator *)&stack0xffffffffffffff7f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xffffffffffffff80,local_28,paVar2);
    AddError(in_RDI,in_stack_ffffffffffffff68);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Parser::ConsumeInteger64(uint64 max_value, uint64* output,
                              const char* error) {
  if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
    if (!io::Tokenizer::ParseInteger(input_->current().text, max_value,
                                     output)) {
      AddError("Integer out of range.");
      // We still return true because we did, in fact, parse an integer.
      *output = 0;
    }
    input_->Next();
    return true;
  } else {
    AddError(error);
    return false;
  }
}